

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O1

void cfl_subtract_average_8x16_c(uint16_t *src,int16_t *dst)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  long lVar6;
  int j;
  int iVar7;
  int i;
  uint16_t *puVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  uVar9 = 0x40;
  iVar7 = 0;
  puVar8 = src;
  do {
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    lVar6 = 0;
    do {
      uVar1 = *(ulong *)(puVar8 + lVar6);
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar1;
      auVar2._12_2_ = (short)(uVar1 >> 0x30);
      auVar3._8_2_ = (short)(uVar1 >> 0x20);
      auVar3._0_8_ = uVar1;
      auVar3._10_4_ = auVar2._10_4_;
      auVar5._6_8_ = 0;
      auVar5._0_6_ = auVar3._8_6_;
      auVar4._4_2_ = (short)(uVar1 >> 0x10);
      auVar4._0_4_ = (uint)uVar1;
      auVar4._6_8_ = SUB148(auVar5 << 0x40,6);
      uVar9 = uVar9 + ((uint)uVar1 & 0xffff);
      iVar10 = iVar10 + auVar4._4_4_;
      iVar11 = iVar11 + auVar3._8_4_;
      iVar12 = iVar12 + (auVar2._10_4_ >> 0x10);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 8);
    uVar9 = iVar12 + iVar10 + iVar11 + uVar9;
    puVar8 = puVar8 + 0x20;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x10);
  iVar7 = 0;
  do {
    lVar6 = 0;
    do {
      dst[lVar6] = src[lVar6] - (short)(uVar9 >> 7);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    src = src + 0x20;
    dst = dst + 0x20;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x10);
  return;
}

Assistant:

CFL_SUB_AVG_FN(c)

static inline int cfl_idx_to_alpha(uint8_t alpha_idx, int8_t joint_sign,
                                   CFL_PRED_TYPE pred_type) {
  const int alpha_sign = (pred_type == CFL_PRED_U) ? CFL_SIGN_U(joint_sign)
                                                   : CFL_SIGN_V(joint_sign);
  if (alpha_sign == CFL_SIGN_ZERO) return 0;
  const int abs_alpha_q3 =
      (pred_type == CFL_PRED_U) ? CFL_IDX_U(alpha_idx) : CFL_IDX_V(alpha_idx);
  return (alpha_sign == CFL_SIGN_POS) ? abs_alpha_q3 + 1 : -abs_alpha_q3 - 1;
}